

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_variableNotEqualByInterfaceType_Test::TestBody
          (Equality_variableNotEqualByInterfaceType_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  VariablePtr v1;
  VariablePtr v2;
  long *local_70;
  AssertionResult local_68;
  long local_58 [2];
  AssertHelper local_48 [8];
  byte local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  shared_ptr *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_68._0_8_ = (shared_ptr *)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"variable","");
  libcellml::Variable::create((string *)&local_30);
  if ((shared_ptr *)local_68._0_8_ != (shared_ptr *)local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  local_68._0_8_ = (shared_ptr *)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"variable","");
  libcellml::Variable::create((string *)&local_20);
  if ((shared_ptr *)local_68._0_8_ != (shared_ptr *)local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  psVar1 = local_30;
  local_68._0_8_ = (shared_ptr *)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"public","");
  libcellml::Variable::setInterfaceType(psVar1);
  if ((shared_ptr *)local_68._0_8_ != (shared_ptr *)local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  local_68._0_8_ = local_20;
  local_68.message_.ptr_ = local_18;
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
    }
  }
  local_40[0] = libcellml::Entity::equals((shared_ptr *)local_30);
  local_40[0] = local_40[0] ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.message_.ptr_);
  }
  if (local_40[0] == 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(char *)local_40,"v1->equals(v2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x9f,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if ((shared_ptr *)local_68._0_8_ != (shared_ptr *)local_58) {
      operator_delete((void *)local_68._0_8_,local_58[0] + 1);
    }
    if (local_70 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._0_8_ = local_30;
  local_68.message_.ptr_ = local_28;
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
    }
  }
  local_40[0] = libcellml::Entity::equals(local_20);
  local_40[0] = local_40[0] ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.message_.ptr_);
  }
  if (local_40[0] == 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(char *)local_40,"v2->equals(v1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0xa0,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if ((shared_ptr *)local_68._0_8_ != (shared_ptr *)local_58) {
      operator_delete((void *)local_68._0_8_,local_58[0] + 1);
    }
    if (local_70 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}